

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O1

void x11_chan_free(Channel *chan)

{
  if (chan->vt == &X11Connection_channelvt) {
    if (chan[-5].vt != (ChannelVtable *)0x0) {
      safefree(chan[-5].vt);
      safefree(*(void **)&chan[-5].initial_fixed_window_size);
    }
    if (chan[-1].vt != (ChannelVtable *)0x0) {
      (**(code **)((chan[-1].vt)->free + 8))();
    }
    safefree(*(void **)&chan[-3].initial_fixed_window_size);
    safefree(chan + -7);
    return;
  }
  __assert_fail("chan->vt == &X11Connection_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                0x196,"void x11_chan_free(Channel *)");
}

Assistant:

static void x11_chan_free(Channel *chan)
{
    assert(chan->vt == &X11Connection_channelvt);
    X11Connection *xconn = container_of(chan, X11Connection, chan);

    if (xconn->auth_protocol) {
        sfree(xconn->auth_protocol);
        sfree(xconn->auth_data);
    }

    if (xconn->s)
        sk_close(xconn->s);

    sfree(xconn->peer_addr);
    sfree(xconn);
}